

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive.cpp
# Opt level: O0

void __thiscall ON_3dmGoo::~ON_3dmGoo(ON_3dmGoo *this)

{
  ON_3dmGoo *this_local;
  
  if (this->m_prev_goo != (ON_3dmGoo *)0x0) {
    this->m_prev_goo->m_next_goo = this->m_next_goo;
  }
  if (this->m_next_goo != (ON_3dmGoo *)0x0) {
    this->m_next_goo->m_prev_goo = this->m_prev_goo;
  }
  if (this->m_goo != (uchar *)0x0) {
    onfree(this->m_goo);
    this->m_goo = (uchar *)0x0;
  }
  return;
}

Assistant:

ON_3dmGoo::~ON_3dmGoo()
{
  if ( m_prev_goo )
    m_prev_goo->m_next_goo = m_next_goo;
  if ( m_next_goo )
    m_next_goo->m_prev_goo = m_prev_goo;
  if ( m_goo ) {
    onfree(m_goo);
    m_goo = 0;
  }
}